

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O3

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  pointer pOVar4;
  pointer pOVar5;
  pointer pOVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  vector<Object,_std::allocator<Object>_> *in_R9;
  long lVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar21;
  undefined1 auVar20 [16];
  double dVar22;
  float fVar23;
  float fVar25;
  undefined1 auVar24 [16];
  uint local_12c;
  uint local_128;
  ulong local_118;
  ulong local_110;
  float *local_f0;
  value_type local_b0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  iVar2 = *(int *)&objects[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((int)feat_blob < (int)in_pad) {
    local_128 = (uint)((long)((ulong)(uint)((int)in_pad >> 0x1f) << 0x20 |
                             (ulong)in_pad & 0xffffffff) / (long)stride);
    local_12c = iVar2 / (int)local_128;
  }
  else {
    local_12c = (uint)((long)((ulong)(uint)((int)feat_blob >> 0x1f) << 0x20 |
                             (ulong)feat_blob & 0xffffffff) / (long)stride);
    local_128 = iVar2 / (int)local_12c;
  }
  uVar3 = anchors->w;
  if (1 < (int)uVar3) {
    iVar2 = *(int *)((long)&objects[1].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
    local_98._0_4_ = (undefined4)stride;
    uVar8 = (ulong)local_128;
    local_98._4_4_ = local_98._0_4_;
    local_98._8_4_ = local_98._0_4_;
    local_98._12_4_ = local_98._0_4_;
    local_118 = 0;
    do {
      if (0 < (int)local_12c) {
        pOVar4 = objects[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pOVar5 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pOVar6 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        lVar13 = (long)pOVar4 * local_118 * (long)pOVar6;
        lVar15 = (long)*(int *)((long)&objects[1].
                                       super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage + 4) * (long)pOVar6
        ;
        uVar1 = *(undefined8 *)((long)anchors->data + local_118 * 8);
        local_88._0_8_ = (undefined8)(float)uVar1;
        local_88._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        local_f0 = (float *)((long)&pOVar5->prob + (long)pOVar4 * (long)pOVar6 * local_118);
        local_110 = 0;
        do {
          if (0 < (int)local_128) {
            local_78 = ZEXT416((uint)(float)(int)local_110);
            uVar16 = 0;
            pfVar12 = local_f0;
            do {
              lVar14 = (uVar16 + local_110 * uVar8) * lVar15;
              fVar17 = expf(-*(float *)((long)&pOVar5->label + lVar14 + lVar13));
              fVar17 = 1.0 / (fVar17 + 1.0);
              if (0.25 <= fVar17) {
                iVar10 = 0;
                fVar18 = -3.4028235e+38;
                if (5 < iVar2) {
                  uVar9 = 0;
                  uVar11 = 0;
                  fVar18 = -3.4028235e+38;
                  do {
                    if (fVar18 < pfVar12[uVar9]) {
                      uVar11 = uVar9 & 0xffffffff;
                      fVar18 = pfVar12[uVar9];
                    }
                    iVar10 = (int)uVar11;
                    uVar9 = uVar9 + 1;
                  } while (iVar2 - 5 != uVar9);
                }
                fVar18 = expf(-fVar18);
                fVar17 = fVar17 * (1.0 / (fVar18 + 1.0));
                if (0.25 <= fVar17) {
                  local_48 = expf(-*(float *)((long)&(pOVar5->rect).x + lVar14 + lVar13));
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(-*(float *)((long)&(pOVar5->rect).y + lVar14 + lVar13));
                  fStack_54 = extraout_XMM0_Db_00;
                  local_68 = expf(-*(float *)((long)&(pOVar5->rect).width + lVar14 + lVar13));
                  fStack_64 = extraout_XMM0_Db_01;
                  fVar18 = expf(-*(float *)((long)&(pOVar5->rect).height + lVar14 + lVar13));
                  auVar20._4_4_ = local_58 + DAT_005a40f0._4_4_;
                  auVar20._0_4_ = local_48 + (float)DAT_005a40f0;
                  auVar20._8_4_ = fStack_44 + DAT_005a40f0._8_4_;
                  auVar20._12_4_ = fStack_54 + DAT_005a40f0._12_4_;
                  auVar24 = divps(_DAT_005a40f0,auVar20);
                  auVar7._4_4_ = fVar18 + DAT_005a40f0._4_4_;
                  auVar7._0_4_ = local_68 + (float)DAT_005a40f0;
                  auVar7._8_4_ = fStack_64 + DAT_005a40f0._8_4_;
                  auVar7._12_4_ = extraout_XMM0_Db_02 + DAT_005a40f0._12_4_;
                  auVar20 = divps(_DAT_005a40f0,auVar7);
                  dVar19 = (double)(auVar20._0_4_ + auVar20._0_4_);
                  dVar22 = (double)(auVar20._4_4_ + auVar20._4_4_);
                  fVar23 = (auVar24._0_4_ + auVar24._0_4_ + -0.5 + (float)(int)uVar16) *
                           (float)local_98._0_4_;
                  fVar25 = (auVar24._4_4_ + auVar24._4_4_ + -0.5 + (float)local_78._0_4_) *
                           (float)local_98._4_4_;
                  fVar18 = (float)(dVar19 * dVar19 * (double)local_88._0_8_) * 0.5;
                  fVar21 = (float)(dVar22 * dVar22 * (double)local_88._8_8_) * 0.5;
                  local_b0.rect.x = fVar23 - fVar18;
                  local_b0.rect.y = fVar25 - fVar21;
                  local_b0.rect.height = (fVar21 + fVar25) - local_b0.rect.y;
                  local_b0.rect.width = (fVar18 + fVar23) - local_b0.rect.x;
                  local_b0.label = iVar10;
                  local_b0.prob = fVar17;
                  std::vector<Object,_std::allocator<Object>_>::push_back(in_R9,&local_b0);
                }
              }
              uVar16 = uVar16 + 1;
              pfVar12 = (float *)((long)pfVar12 + lVar15);
            } while (uVar16 != uVar8);
          }
          local_110 = local_110 + 1;
          local_f0 = (float *)((long)local_f0 + lVar15 * uVar8);
        } while (local_110 != local_12c);
      }
      local_118 = local_118 + 1;
    } while (local_118 != uVar3 >> 1);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = feat_blob.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = feat_blob.w - 5;

    const int num_anchors = anchors.w / 2;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        const ncnn::Mat feat = feat_blob.channel(q);

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                const float* featptr = feat.row(i * num_grid_x + j);
                float box_confidence = sigmoid(featptr[4]);
                if (box_confidence >= prob_threshold)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int k = 0; k < num_class; k++)
                    {
                        float score = featptr[5 + k];
                        if (score > class_score)
                        {
                            class_index = k;
                            class_score = score;
                        }
                    }
                    float confidence = box_confidence * sigmoid(class_score);
                    if (confidence >= prob_threshold)
                    {
                        // yolov5/models/yolo.py Detect forward
                        // y = x[i].sigmoid()
                        // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                        // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                        float dx = sigmoid(featptr[0]);
                        float dy = sigmoid(featptr[1]);
                        float dw = sigmoid(featptr[2]);
                        float dh = sigmoid(featptr[3]);

                        float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                        float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                        float pb_w = pow(dw * 2.f, 2) * anchor_w;
                        float pb_h = pow(dh * 2.f, 2) * anchor_h;

                        float x0 = pb_cx - pb_w * 0.5f;
                        float y0 = pb_cy - pb_h * 0.5f;
                        float x1 = pb_cx + pb_w * 0.5f;
                        float y1 = pb_cy + pb_h * 0.5f;

                        Object obj;
                        obj.rect.x = x0;
                        obj.rect.y = y0;
                        obj.rect.width = x1 - x0;
                        obj.rect.height = y1 - y0;
                        obj.label = class_index;
                        obj.prob = confidence;

                        objects.push_back(obj);
                    }
                }
            }
        }
    }
}